

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

void burstsort_superalphabet_vector(uchar **strings,size_t n)

{
  _WordT *p_Var1;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar4;
  TrieNode<unsigned_short> *pTVar5;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar6;
  TrieNode<unsigned_short> *pTVar7;
  byte bVar8;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *in_RCX;
  size_t sVar9;
  size_t depth;
  uchar *str;
  BurstSimple<unsigned_short> local_61;
  uchar **local_60;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *local_58;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *local_50;
  TrieNode<unsigned_short> *local_48;
  size_t local_40;
  size_t local_38;
  
  local_60 = strings;
  pTVar5 = (TrieNode<unsigned_short> *)operator_new(0x82000);
  memset(pTVar5,0,0x82000);
  local_40 = n;
  if (n != 0) {
    sVar9 = 0;
    local_48 = pTVar5;
    do {
      local_58 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)local_60[sVar9];
      if (local_58 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*local_58 == (vector<unsigned_char*,std::allocator<unsigned_char*>>)0x0) {
        in_RCX = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0;
      }
      else {
        in_RCX = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (ulong)CONCAT11(*local_58,local_58[1]);
      }
      uVar3 = (ulong)in_RCX >> 6;
      bVar8 = (byte)in_RCX;
      depth = 2;
      uVar2 = (local_48->is_trie).super__Base_bitset<1024UL>._M_w[uVar3] >> ((ulong)in_RCX & 0x3f);
      pvVar4 = in_RCX;
      pTVar5 = local_48;
      while (local_38 = sVar9, (uVar2 & 1) != 0) {
        if ((char)pvVar4 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 32000U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                       );
        }
        if (local_58[depth] == (vector<unsigned_char*,std::allocator<unsigned_char*>>)0x0) {
          pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0;
        }
        else {
          pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                   (ulong)CONCAT11(local_58[depth],local_58[depth + 1]);
        }
        pTVar5 = (TrieNode<unsigned_short> *)(pTVar5->buckets)._M_elems[(long)pvVar4];
        bVar8 = (byte)pvVar6;
        uVar3 = (ulong)pvVar6 >> 6;
        in_RCX = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (pTVar5->is_trie).super__Base_bitset<1024UL>._M_w[uVar3];
        depth = depth + 2;
        pvVar4 = pvVar6;
        uVar2 = (ulong)in_RCX >> ((ulong)pvVar6 & 0x3f);
      }
      pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
               (pTVar5->buckets)._M_elems[(long)pvVar4];
      if (pvVar6 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        pvVar6 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
        *(undefined8 *)pvVar6 = 0;
        *(undefined8 *)(pvVar6 + 8) = 0;
        *(undefined8 *)(pvVar6 + 0x10) = 0;
        (pTVar5->buckets)._M_elems[(long)pvVar4] = pvVar6;
      }
      __position._M_current = *(uchar ***)(pvVar6 + 8);
      if (__position._M_current == *(uchar ***)(pvVar6 + 0x10)) {
        local_50 = pvVar6;
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar6,__position,(uchar **)&local_58);
        pvVar6 = local_50;
      }
      else {
        *__position._M_current = (uchar *)local_58;
        *(long *)(pvVar6 + 8) = *(long *)(pvVar6 + 8) + 8;
        in_RCX = local_58;
      }
      if (((char)pvVar4 != '\0') &&
         (in_RCX = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                   (*(long *)(pvVar6 + 8) - *(long *)pvVar6),
         (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x3e800 <
         (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
         (*(long *)(pvVar6 + 8) - *(long *)pvVar6))) {
        pTVar7 = BurstSimple<unsigned_short>::operator()
                           (&local_61,
                            (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)pvVar6,
                            depth);
        (pTVar5->buckets)._M_elems[(long)pvVar4] = pTVar7;
        p_Var1 = (pTVar5->is_trie).super__Base_bitset<1024UL>._M_w + uVar3;
        *p_Var1 = *p_Var1 | 1L << (bVar8 & 0x3f);
        if (*(void **)pvVar6 != (void *)0x0) {
          operator_delete(*(void **)pvVar6);
        }
        operator_delete(pvVar6);
        in_RCX = pvVar6;
      }
      sVar9 = local_38 + 1;
      pTVar5 = local_48;
    } while (sVar9 != local_40);
  }
  traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,void(*)(unsigned_char**,int,int),unsigned_short>
            (pTVar5,local_60,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
  return;
}

Assistant:

void burstsort_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<32000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}